

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_foreach_do::translate
          (method_foreach_do *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  initializer_list<cs::statement_base_*> __l;
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  var_id *this_00;
  element_type *ptr;
  statement_base *this_01;
  allocator_type *__a;
  _Elt_pointer pptVar5;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  string *it;
  tree_type<cs::token_base_*> *t;
  string *in_stack_fffffffffffffd08;
  compiler_type *in_stack_fffffffffffffd10;
  _Self *in_stack_fffffffffffffd18;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffd20;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_02;
  iterator *in_stack_fffffffffffffd50;
  context_t *c;
  tree_type<cs::token_base_*> *tree;
  statement_expression *this_03;
  token_base *ptr_00;
  context_t *in_stack_fffffffffffffd70;
  allocator_type *in_stack_fffffffffffffd78;
  allocator *paVar6;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffd80;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  undefined1 uVar7;
  shared_ptr<cs::context_type> local_268;
  undefined1 local_251;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_250;
  string local_1c8 [39];
  undefined1 local_1a1 [33];
  context_t local_180 [2];
  tree_type<cs::token_base_*> local_160 [24];
  tree_node *local_a0;
  string *local_98;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  tree_node *local_68;
  undefined1 local_5d;
  allocator local_49;
  string local_48 [32];
  tree_node *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffd20);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_28 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd08);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd50);
  if (*pptVar3 == (token_base *)0x0) {
    local_5d = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    paVar6 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Null pointer accessed.",paVar6);
    internal_error::internal_error
              ((internal_error *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_5d = 0;
    __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_68 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd08);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd50);
  iVar1 = (*(*pptVar3)->_vptr_token_base[2])();
  if (iVar1 != 4) {
    local_8a = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    paVar6 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Wrong grammar in foreach statement, expect <id>",paVar6);
    compile_error::compile_error
              ((compile_error *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    local_8a = 0;
    __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_a0 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd08);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffd50);
  this_00 = token_id::get_id((token_id *)*pptVar3);
  local_98 = var_id::operator_cast_to_string_(this_00);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x25298a);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x252997);
  ptr = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x25299f);
  c = local_180;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd08);
  tree = local_160;
  std::operator+(in_stack_fffffffffffffd18,(difference_type)in_stack_fffffffffffffd10);
  this_03 = (statement_expression *)(local_1a1 + 1);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffffd08);
  ptr_00 = (token_base *)local_1a1;
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x252a06
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  compiler_type::translate
            (in_stack_fffffffffffffd10,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)in_stack_fffffffffffffd08,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x252a3e);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)this_03);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x252a5a
            );
  this_01 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd10);
  uVar7 = 1;
  std::__cxx11::string::string(local_1c8,(string *)local_98);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffd20);
  __a = (allocator_type *)
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  token_expr::get_tree(*(token_expr **)__a);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd10,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffd08);
  pptVar5 = (_Elt_pointer)statement_base::operator_new((size_t)in_stack_fffffffffffffd10);
  local_251 = 1;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front(in_stack_fffffffffffffd20);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffd10,(size_type)in_stack_fffffffffffffd08);
  token_expr::get_tree((token_expr *)*pptVar2);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd10,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffd08);
  this_02 = &local_250;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffd10,
             (shared_ptr<cs::context_type> *)in_stack_fffffffffffffd08);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_02);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_02);
  statement_expression::statement_expression(this_03,tree,c,(token_base *)ptr);
  local_251 = 0;
  local_250.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_last =
       (_Elt_pointer)
       &local_250.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_first;
  local_250.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x1;
  local_250.super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = pptVar5;
  std::allocator<cs::statement_base_*>::allocator((allocator<cs::statement_base_*> *)0x252bb1);
  __l._M_len = (size_type)c;
  __l._M_array = (iterator)ptr;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_01,__l,__a);
  std::shared_ptr<cs::context_type>::shared_ptr
            (&local_268,(shared_ptr<cs::context_type> *)in_stack_fffffffffffffd08);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)this_02);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_02);
  statement_foreach::statement_foreach
            ((statement_foreach *)CONCAT17(uVar7,in_stack_fffffffffffffd90),
             (string *)in_stack_fffffffffffffd88,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffd80,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,ptr_00);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x252c45);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_03);
  std::allocator<cs::statement_base_*>::~allocator((allocator<cs::statement_base_*> *)0x252c5f);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x252c6c);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x252c79);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x252c86);
  std::__cxx11::string::~string(local_1c8);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_03);
  return this_01;
}

Assistant:

statement_base *
	method_foreach_do::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar in foreach statement, expect <id>");
		const std::string &it = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		return new statement_foreach(it, static_cast<token_expr *>(raw.front().at(3))->get_tree(), {
			new statement_expression(static_cast<token_expr *>(raw.front().at(5))->get_tree(),
			                         context, raw.front().back())
		}, context,
		raw.front().back());
	}